

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O3

int NULLCPugiXML::xml_node__traverse
              (NULLCFuncPtr begin,NULLCFuncPtr for_each,NULLCFuncPtr end,xml_node *ptr)

{
  bool bVar1;
  undefined1 local_60 [20];
  uint local_4c;
  void *local_48;
  uint local_40;
  void *local_3c;
  uint local_34;
  
  pugi::xml_tree_walker::xml_tree_walker((xml_tree_walker *)local_60);
  local_60._0_8_ = &PTR__xml_tree_walker_003e8220;
  local_60._12_8_ = begin.context;
  local_4c = begin.id;
  local_48 = for_each.context;
  local_40 = for_each.id;
  local_3c = end.context;
  local_34 = end.id;
  bVar1 = pugi::xml_node::traverse(&ptr->node,(xml_tree_walker *)local_60);
  pugi::xml_tree_walker::~xml_tree_walker((xml_tree_walker *)local_60);
  return (uint)bVar1;
}

Assistant:

int xml_node__traverse(NULLCFuncPtr begin, NULLCFuncPtr for_each, NULLCFuncPtr end, xml_node* ptr)
	{
		xml_tree_walker walker = xml_tree_walker(begin, for_each, end);
		return ptr->node.traverse(walker);
	}